

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<HLSLVertexAttributeRemapNamed,_8UL>::push_back
          (SmallVector<HLSLVertexAttributeRemapNamed,_8UL> *this,HLSLVertexAttributeRemapNamed *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  HLSLVertexAttributeRemapNamed *pHVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  HLSLVertexAttributeRemapNamed *pHVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  reserve(this,(this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size + 1);
  pHVar7 = (this->super_VectorView<HLSLVertexAttributeRemapNamed>).ptr;
  sVar4 = (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size;
  pHVar3 = pHVar7 + sVar4;
  pHVar7 = pHVar7 + sVar4;
  paVar8 = &(pHVar7->name).field_2;
  (pHVar7->name)._M_dataplus._M_p = (pointer)paVar8;
  pcVar5 = (t->name)._M_dataplus._M_p;
  paVar1 = &(t->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(t->name).field_2 + 8);
    paVar8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pHVar7->name).field_2 + 8) = uVar6;
  }
  else {
    (pHVar3->name)._M_dataplus._M_p = pcVar5;
    (pHVar3->name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pHVar3->name)._M_string_length = (t->name)._M_string_length;
  (t->name)._M_dataplus._M_p = (pointer)paVar1;
  (t->name)._M_string_length = 0;
  (t->name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(pHVar3->semantic).field_2;
  (pHVar3->semantic)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (t->semantic)._M_dataplus._M_p;
  paVar8 = &(t->semantic).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar6 = *(undefined8 *)((long)&(t->semantic).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(pHVar3->semantic).field_2 + 8) = uVar6;
  }
  else {
    (pHVar3->semantic)._M_dataplus._M_p = pcVar5;
    (pHVar3->semantic).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (pHVar3->semantic)._M_string_length = (t->semantic)._M_string_length;
  (t->semantic)._M_dataplus._M_p = (pointer)paVar8;
  (t->semantic)._M_string_length = 0;
  (t->semantic).field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}